

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O1

void test_cpp_clear_64(void **param_1)

{
  bool bVar1;
  long lVar2;
  Roaring64Map roaring;
  Roaring64Map local_68;
  
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68.roarings._M_t._M_impl._0_8_ = 0;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68.copyOnWrite = false;
  lVar2 = 0;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    bVar1 = ::roaring::Roaring64Map::addChecked
                      (&local_68,*(uint64_t *)((long)&DAT_00138ba0 + lVar2));
    _assert_true((ulong)bVar1,"roaring.addChecked(values64[i])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/cpp_unit.cpp"
                 ,0x500);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x20);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::clear((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
           *)&local_68);
  bVar1 = ::roaring::Roaring64Map::isEmpty(&local_68);
  _assert_true((ulong)bVar1,"roaring.isEmpty()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/cpp_unit.cpp"
               ,0x505);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&local_68);
  return;
}

Assistant:

DEFINE_TEST(test_example_false) { test_example(false); }